

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O2

void IFLT(ffe_t *data,uint size,uint index)

{
  ffe_t b;
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ffe_t fVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar7 = 1;
  while ((uint)uVar7 < size) {
    uVar3 = (uint)uVar7 * 2;
    uVar5 = 0;
    while (uVar6 = (uint)uVar7, uVar6 < size) {
      b = skewVec[(index - 1) + uVar6];
      uVar9 = uVar7;
      for (uVar8 = (ulong)uVar5; uVar8 < uVar7; uVar8 = uVar8 + 1) {
        uVar1 = data[uVar9];
        uVar2 = data[uVar8];
        data[uVar9] = uVar1 ^ uVar2;
        if (b != 0xffff) {
          fVar4 = mulE(uVar1 ^ uVar2,b);
          data[uVar8] = data[uVar8] ^ fVar4;
        }
        uVar9 = (ulong)((int)uVar9 + 1);
      }
      uVar5 = uVar5 + uVar3;
      uVar7 = (ulong)(uVar6 + uVar3);
    }
    uVar7 = (ulong)uVar3;
  }
  return;
}

Assistant:

static void IFLT(ffe_t* data, const unsigned size, const unsigned index)
{
    for (unsigned width = 1; width < size; width <<= 1)
    {
        for (unsigned j = width; j < size; j += (width << 1))
        {
            const ffe_t skew = skewVec[j + index - 1];

            for (unsigned i = j - width; i < j; ++i)
                ifft_butterfly(data[i], data[i + width], skew);
        }
    }
}